

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::
InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
::push_back(InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
            *this,rvalue_reference v)

{
  rvalue_reference v_local;
  InlinedVector<(anonymous_namespace)::CrossingGraphEdge,_2UL,_std::allocator<(anonymous_namespace)::CrossingGraphEdge>_>
  *this_local;
  
  emplace_back<(anonymous_namespace)::CrossingGraphEdge>(this,v);
  return;
}

Assistant:

void push_back(rvalue_reference v) {
    static_cast<void>(emplace_back(std::move(v)));
  }